

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O1

int64_t sensors_analytics::utils::GenerateTrackId(void)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  long *plVar4;
  int *piVar5;
  long lVar6;
  undefined8 uVar7;
  ulong uVar8;
  long *plVar9;
  uint __len;
  ulong uVar10;
  ulong __val;
  uint uVar11;
  string timestamp;
  string second;
  string timestamp_sub;
  string first;
  string second_sub;
  string first_sub;
  long *local_138;
  long local_128;
  long lStack_120;
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  char *local_f8 [2];
  char local_e8 [16];
  timeval local_d8;
  undefined1 local_c8 [16];
  char *local_b8 [2];
  char local_a8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long *local_38;
  
  iVar2 = rand();
  uVar3 = iVar2 % 99 + 100;
  uVar11 = -uVar3;
  if (0 < (int)uVar3) {
    uVar11 = uVar3;
  }
  __len = 1;
  uVar3 = 3 - (uVar11 < 100);
  if (uVar11 < 10) {
    uVar3 = 1;
  }
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct((ulong)local_b8,(char)uVar3);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_b8[0],uVar3,uVar11);
  std::__cxx11::string::substr((ulong)&local_58,(ulong)local_b8);
  iVar2 = rand();
  uVar3 = iVar2 % 999 + 1000;
  uVar11 = -uVar3;
  if (0 < (int)uVar3) {
    uVar11 = uVar3;
  }
  if ((9 < uVar11) && (__len = 2, 99 < uVar11)) {
    __len = 4 - (uVar11 < 1000);
  }
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct((ulong)local_f8,(char)__len);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_f8[0],__len,uVar11);
  std::__cxx11::string::substr((ulong)&local_78,(ulong)local_f8);
  gettimeofday(&local_d8,(__timezone_ptr_t)0x0);
  uVar10 = local_d8.tv_usec / 1000 + local_d8.tv_sec * 1000;
  __val = -uVar10;
  if (0 < (long)uVar10) {
    __val = uVar10;
  }
  uVar11 = 1;
  if (9 < __val) {
    uVar8 = __val;
    uVar3 = 4;
    do {
      uVar11 = uVar3;
      if (uVar8 < 100) {
        uVar11 = uVar11 - 2;
        goto LAB_0010e870;
      }
      if (uVar8 < 1000) {
        uVar11 = uVar11 - 1;
        goto LAB_0010e870;
      }
      if (uVar8 < 10000) goto LAB_0010e870;
      bVar1 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      uVar3 = uVar11 + 4;
    } while (bVar1);
    uVar11 = uVar11 + 1;
  }
LAB_0010e870:
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct((ulong)local_118,(char)uVar11 - (char)((long)uVar10 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_118[0] + -((long)uVar10 >> 0x3f),uVar11,__val);
  std::__cxx11::string::substr((ulong)&local_d8,(ulong)local_118);
  std::operator+(&local_98,&local_58,&local_78);
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_98,local_d8.tv_sec);
  plVar9 = plVar4 + 2;
  if ((long *)*plVar4 == plVar9) {
    local_128 = *plVar9;
    lStack_120 = plVar4[3];
    local_138 = &local_128;
  }
  else {
    local_128 = *plVar9;
    local_138 = (long *)*plVar4;
  }
  *plVar4 = (long)plVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  piVar5 = __errno_location();
  iVar2 = *piVar5;
  *piVar5 = 0;
  lVar6 = strtol((char *)local_138,(char **)&local_38,10);
  if (local_38 == local_138) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar6 == lVar6) && (*piVar5 != 0x22)) {
    if (*piVar5 == 0) {
      *piVar5 = iVar2;
    }
    if (local_138 != &local_128) {
      operator_delete(local_138);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((undefined1 *)local_d8.tv_sec != local_c8) {
      operator_delete((void *)local_d8.tv_sec);
    }
    if (local_118[0] != local_108) {
      operator_delete(local_118[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if (local_f8[0] != local_e8) {
      operator_delete(local_f8[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0]);
    }
    return (long)(int)lVar6;
  }
  uVar7 = std::__throw_out_of_range("stoi");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((undefined1 *)local_d8.tv_sec != local_c8) {
    operator_delete((void *)local_d8.tv_sec);
  }
  if (local_118[0] != local_108) {
    operator_delete(local_118[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0]);
  }
  _Unwind_Resume(uVar7);
}

Assistant:

int64_t GenerateTrackId() {
    string first = std::to_string(rand() % 99 + 100);
    string first_sub = first.substr(first.length() - 2, 2);

    string second = std::to_string(rand() % 999 + 1000);
    string second_sub = second.substr(second.length() - 3, 3);

    string timestamp = std::to_string(CurrentTimestamp());
    string timestamp_sub = timestamp.substr(timestamp.length() - 4, 4);

    return std::stoi(first_sub + second_sub + timestamp_sub);
}